

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O2

void __thiscall namedlabels::~namedlabels(namedlabels *this)

{
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *this_00;
  pointer psVar1;
  
  psVar1 = (this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
      super__Vector_impl_data._M_finish != psVar1) {
    free(psVar1->begin);
  }
  v_hashmap<substring,_unsigned_long>::iter(&this->name2id,deleter);
  this_00 = &(this->name2id).dat;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::delete_v(this_00);
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::delete_v(this_00);
  std::_Vector_base<substring,_std::allocator<substring>_>::~_Vector_base
            ((_Vector_base<substring,_std::allocator<substring>_> *)this);
  return;
}

Assistant:

~namedlabels()
  {
    if (id2name.size() > 0)
      free(id2name[0].begin);
    name2id.iter(deleter);
    name2id.delete_v();
  }